

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

bool __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::valid_offset
          (segment_index_iterator<std::_List_iterator<char>_> *this,size_t offset)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((offset != 0) &&
     (peVar1 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,
     lVar2 = (long)(peVar1->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_start,
     (long)(peVar1->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4 != offset)) {
    bVar3 = (*(uint *)(lVar2 + 8 + offset * 0x10) & this->mask_) != 0;
  }
  return bVar3;
}

Assistant:

bool valid_offset(size_t offset) const
                    {
                        return  offset == 0 
                                || offset == size() // make sure we not acess index[size]
                                || (index()[offset].rule & mask_)!=0;
                    }